

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O2

void __thiscall Nova::Grid_Iterator<float,_3>::Next_Helper(Grid_Iterator<float,_3> *this)

{
  T_INDEX *this_00;
  int iVar1;
  int *piVar2;
  int i;
  
  this_00 = &this->index;
  (this->index)._data._M_elems[2] = (this->region).min_corner._data._M_elems[2];
  i = 1;
  while( true ) {
    if (i < 0) {
      Reset(this,this->current_region + 1);
      return;
    }
    piVar2 = Vector<int,_3,_true>::operator()(this_00,i);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_3,_true>::operator()(&(this->region).max_corner,i);
    if (iVar1 < *piVar2) break;
    piVar2 = Vector<int,_3,_true>::operator()(&(this->region).min_corner,i);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_3,_true>::operator()(this_00,i);
    *piVar2 = iVar1;
    i = i + -1;
  }
  piVar2 = Vector<int,_3,_true>::operator()(this_00,i);
  *piVar2 = *piVar2 + 1;
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }